

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::CoverageBinSymbol::resolve(CoverageBinSymbol *this)

{
  SyntaxKind SVar1;
  Scope *scope;
  size_type sVar2;
  size_type sVar3;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar4;
  int iVar5;
  BinsSelectionSyntax *pBVar6;
  ExpressionSyntax *pEVar7;
  undefined4 extraout_var;
  BinsSelectExpressionSyntax *pBVar8;
  undefined4 extraout_var_00;
  CoverpointSymbol *pCVar9;
  Type *this_00;
  CoverageBinsSyntax *pCVar10;
  undefined4 extraout_var_01;
  Expression *pEVar11;
  CoverageBinInitializerSyntax *pCVar12;
  SyntaxNode *pSVar13;
  RangeCoverageBinInitializerSyntax *pRVar14;
  OpenRangeListSyntax *pOVar15;
  ExpressionCoverageBinInitializerSyntax *pEVar16;
  Type *this_01;
  Type *rhs;
  IdWithExprCoverageBinInitializerSyntax *pIVar17;
  WithClauseSyntax *withSyntax;
  Diagnostic *pDVar18;
  TransListCoverageBinInitializerSyntax *pTVar19;
  TransSetSyntax *pTVar20;
  TransRangeSyntax *args;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  logic_error *this_02;
  socklen_t __len;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  iterator *src;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *pEVar21;
  EVP_PKEY_CTX *extraout_RDX_02;
  iterator *extraout_RDX_03;
  size_type extraout_RDX_04;
  size_type extraout_RDX_05;
  LookupLocation LVar22;
  string_view __x;
  SourceRange sourceRange;
  LookupLocation lookupLocation;
  allocator<char> local_241;
  Compilation *local_240;
  not_null<slang::syntax::CoverageBinInitializerSyntax_*> init;
  iterator __begin4;
  iterator __begin3_1;
  ASTContext context;
  anon_class_40_5_a2b3541b bindWithExpr;
  iterator __begin3;
  ParentList local_168;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  
  if (this->isResolved == true) {
    assert::assertFailed
              ("!isResolved",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
               ,0x1db,"void slang::ast::CoverageBinSymbol::resolve() const");
  }
  this->isResolved = true;
  pSVar13 = (this->super_Symbol).originatingSyntax;
  if ((pSVar13 != (SyntaxNode *)0x0) &&
     (scope = (this->super_Symbol).parentScope, scope != (Scope *)0x0)) {
    local_240 = scope->compilation;
    LVar22 = LookupLocation::before(&this->super_Symbol);
    lookupLocation._8_8_ = LVar22._8_8_ & 0xffffffff;
    lookupLocation.scope = LVar22.scope;
    ASTContext::ASTContext(&context,scope,lookupLocation,(bitmask<slang::ast::ASTFlags>)0x0);
    if (pSVar13->kind == BinsSelection) {
      pBVar6 = slang::syntax::SyntaxNode::as<slang::syntax::BinsSelectionSyntax>(pSVar13);
      if (pBVar6->iff != (CoverageIffClauseSyntax *)0x0) {
        pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pBVar6->iff->expr);
        iVar5 = Expression::bind((int)pEVar7,(sockaddr *)&context,0x8000000);
        this->iffExpr = (Expression *)CONCAT44(extraout_var,iVar5);
        ASTContext::requireBooleanConvertible(&context,(Expression *)CONCAT44(extraout_var,iVar5));
      }
      pBVar8 = not_null<slang::syntax::BinsSelectExpressionSyntax_*>::get(&pBVar6->expr);
      iVar5 = BinsSelectExpr::bind((int)pBVar8,(sockaddr *)&context,__len);
      this->selectExpr = (BinsSelectExpr *)CONCAT44(extraout_var_00,iVar5);
    }
    else {
      pCVar9 = Symbol::as<slang::ast::CoverpointSymbol>(scope->thisSym);
      this_00 = DeclaredType::getType(&pCVar9->declaredType);
      pCVar10 = slang::syntax::SyntaxNode::as<slang::syntax::CoverageBinsSyntax>(pSVar13);
      if (pCVar10->iff != (CoverageIffClauseSyntax *)0x0) {
        pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pCVar10->iff->expr);
        iVar5 = Expression::bind((int)pEVar7,(sockaddr *)&context,0x8000000);
        this->iffExpr = (Expression *)CONCAT44(extraout_var_01,iVar5);
        ASTContext::requireBooleanConvertible
                  (&context,(Expression *)CONCAT44(extraout_var_01,iVar5));
      }
      if ((pCVar10->size != (CoverageBinsArraySizeSyntax *)0x0) &&
         (pEVar7 = pCVar10->size->expr, pEVar7 != (ExpressionSyntax *)0x0)) {
        pEVar11 = bindCovergroupExpr(pEVar7,&context,(Type *)0x0,(bitmask<slang::ast::ASTFlags>)0x0)
        ;
        this->numberOfBinsExpr = pEVar11;
        ASTContext::requireIntegral(&context,pEVar11);
      }
      bindWithExpr.comp = local_240;
      init.ptr = (pCVar10->initializer).ptr;
      bindWithExpr.context = &context;
      bindWithExpr.coverpoint = pCVar9;
      bindWithExpr.type = this_00;
      bindWithExpr.this = this;
      pCVar12 = not_null<slang::syntax::CoverageBinInitializerSyntax_*>::get(&init);
      SVar1 = (pCVar12->super_SyntaxNode).kind;
      if (SVar1 != DefaultCoverageBinInitializer) {
        if (SVar1 == ExpressionCoverageBinInitializer) {
          pSVar13 = &not_null<slang::syntax::CoverageBinInitializerSyntax_*>::get(&init)->
                     super_SyntaxNode;
          pEVar16 = slang::syntax::SyntaxNode::
                    as<slang::syntax::ExpressionCoverageBinInitializerSyntax>(pSVar13);
          pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pEVar16->expr);
          pEVar11 = bindCovergroupExpr(pEVar7,&context,(Type *)0x0,
                                       (bitmask<slang::ast::ASTFlags>)0x0);
          this->setCoverageExpr = pEVar11;
          bVar4 = Expression::bad(pEVar11);
          if (!bVar4) {
            this_01 = not_null<const_slang::ast::Type_*>::get(&this->setCoverageExpr->type);
            bVar4 = Type::isArray(this_01);
            if ((bVar4) && (bVar4 = Type::isAssociativeArray(this_01), !bVar4)) {
              rhs = Type::getArrayElementType(this_01);
              bVar4 = Type::isAssignmentCompatible(this_00,rhs);
              if (bVar4) {
                return;
              }
            }
            pDVar18 = ASTContext::addDiag(&context,(DiagCode)0x120006,
                                          this->setCoverageExpr->sourceRange);
            pDVar18 = ast::operator<<(pDVar18,this_01);
            pDVar18 = Diagnostic::operator<<(pDVar18,(pCVar9->super_Symbol).name);
            ast::operator<<(pDVar18,this_00);
          }
        }
        else if (SVar1 == IdWithExprCoverageBinInitializer) {
          pSVar13 = &not_null<slang::syntax::CoverageBinInitializerSyntax_*>::get(&init)->
                     super_SyntaxNode;
          pIVar17 = slang::syntax::SyntaxNode::
                    as<slang::syntax::IdWithExprCoverageBinInitializerSyntax>(pSVar13);
          withSyntax = not_null<slang::syntax::WithClauseSyntax_*>::get(&pIVar17->withClause);
          resolve::anon_class_40_5_a2b3541b::operator()(&bindWithExpr,withSyntax);
          __x = parsing::Token::valueText(&pIVar17->id);
          if ((__x._M_len != 0) &&
             (__y._M_len = (pCVar9->super_Symbol).name._M_len,
             __y._M_str = (pCVar9->super_Symbol).name._M_str, bVar4 = std::operator!=(__x,__y),
             bVar4)) {
            sourceRange = parsing::Token::range(&pIVar17->id);
            pDVar18 = ASTContext::addDiag(&context,(DiagCode)0x100006,sourceRange);
            Diagnostic::operator<<(pDVar18,(pCVar9->super_Symbol).name);
          }
        }
        else if (SVar1 == TransListCoverageBinInitializer) {
          __begin3.list = &local_168;
          __begin3.index = 0;
          pSVar13 = &not_null<slang::syntax::CoverageBinInitializerSyntax_*>::get(&init)->
                     super_SyntaxNode;
          pTVar19 = slang::syntax::SyntaxNode::
                    as<slang::syntax::TransListCoverageBinInitializerSyntax>(pSVar13);
          src = &__begin3_1;
          __begin3_1.index = 0;
          sVar2 = (pTVar19->sets).elements.size_;
          __begin3_1.list = &pTVar19->sets;
          for (; (__begin3_1.list != &pTVar19->sets || (__begin3_1.index != sVar2 + 1 >> 1));
              __begin3_1.index = __begin3_1.index + 1) {
            pTVar20 = slang::syntax::SeparatedSyntaxList<slang::syntax::TransSetSyntax>::
                      iterator_base<slang::syntax::TransSetSyntax_*>::operator*(&__begin3_1);
            buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
                 (pointer)buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
            buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
            buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 4;
            __begin4.index = 0;
            sVar3 = (pTVar20->ranges).elements.size_;
            pEVar21 = extraout_RDX_01;
            __begin4.list = &pTVar20->ranges;
            for (; (__begin4.list != &pTVar20->ranges || (__begin4.index != sVar3 + 1 >> 1));
                __begin4.index = __begin4.index + 1) {
              args = slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>::
                     iterator_base<slang::syntax::TransRangeSyntax_*>::operator*
                               ((iterator_base<slang::syntax::TransRangeSyntax_*> *)&__begin4);
              SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList>::
              emplace_back<slang::syntax::TransRangeSyntax&,slang::ast::Type_const&,slang::ast::ASTContext&>
                        ((SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *)&buffer,
                         args,this_00,&context);
              pEVar21 = extraout_RDX_02;
            }
            iVar5 = SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList>::copy
                              ((SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *)
                               &buffer,(EVP_PKEY_CTX *)local_240,pEVar21);
            __begin4.list = (ParentList *)CONCAT44(extraout_var_02,iVar5);
            SmallVectorBase<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
            ::
            emplace_back<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
                      ((SmallVectorBase<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
                        *)&__begin3,
                       (span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>
                        *)&__begin4);
            SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList>::~SmallVectorBase
                      ((SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *)&buffer);
            src = extraout_RDX_03;
          }
          iVar5 = SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                  ::copy((SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                          *)&__begin3,(EVP_PKEY_CTX *)local_240,(EVP_PKEY_CTX *)src);
          (this->transList).data_ = (pointer)CONCAT44(extraout_var_04,iVar5);
          (this->transList).size_ = extraout_RDX_05;
          SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
          ::~SmallVectorBase((SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                              *)&__begin3);
        }
        else {
          if (SVar1 != RangeCoverageBinInitializer) {
            this_02 = (logic_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_108,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
                       ,&local_241);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__begin4,&local_108,":");
            std::__cxx11::to_string(&local_128,0x246);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__begin3_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__begin4,&local_128);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__begin3,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__begin3_1,": ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &buffer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&__begin3,"Default case should be unreachable!");
            std::logic_error::logic_error(this_02,(string *)&buffer);
            __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
               (pointer)buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
          buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
          buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
          pSVar13 = &not_null<slang::syntax::CoverageBinInitializerSyntax_*>::get(&init)->
                     super_SyntaxNode;
          pRVar14 = slang::syntax::SyntaxNode::as<slang::syntax::RangeCoverageBinInitializerSyntax>
                              (pSVar13);
          pOVar15 = not_null<slang::syntax::OpenRangeListSyntax_*>::get(&pRVar14->ranges);
          __begin3.index = 0;
          sVar2 = (pOVar15->valueRanges).elements.size_;
          pEVar21 = extraout_RDX;
          __begin3.list = &pOVar15->valueRanges;
          for (; (__begin3.list != &pOVar15->valueRanges || (__begin3.index != sVar2 + 1 >> 1));
              __begin3.index = __begin3.index + 1) {
            pEVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                     iterator_base<slang::syntax::ExpressionSyntax_*>::operator*(&__begin3);
            __begin3_1.list =
                 (ParentList *)
                 bindCovergroupExpr(pEVar7,&context,this_00,
                                    (bitmask<slang::ast::ASTFlags>)
                                    ((ulong)((pEVar7->super_SyntaxNode).kind == OpenRangeExpression)
                                    << 0xb));
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)&buffer,
                       (Expression **)&__begin3_1);
            pEVar21 = extraout_RDX_00;
          }
          iVar5 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                            (&buffer.super_SmallVectorBase<const_slang::ast::Expression_*>,
                             (EVP_PKEY_CTX *)local_240,pEVar21);
          (this->values).data_ = (pointer)CONCAT44(extraout_var_03,iVar5);
          (this->values).size_ = extraout_RDX_04;
          if (pRVar14->withClause != (WithClauseSyntax *)0x0) {
            resolve::anon_class_40_5_a2b3541b::operator()(&bindWithExpr,pRVar14->withClause);
          }
          SmallVectorBase<const_slang::ast::Expression_*>::~SmallVectorBase
                    (&buffer.super_SmallVectorBase<const_slang::ast::Expression_*>);
        }
      }
    }
    return;
  }
  assert::assertFailed
            ("syntax && scope",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
             ,0x1e0,"void slang::ast::CoverageBinSymbol::resolve() const");
}

Assistant:

void CoverageBinSymbol::resolve() const {
    ASSERT(!isResolved);
    isResolved = true;

    auto syntax = getSyntax();
    auto scope = getParentScope();
    ASSERT(syntax && scope);

    auto& comp = scope->getCompilation();
    ASTContext context(*scope, LookupLocation::before(*this));

    if (syntax->kind == SyntaxKind::BinsSelection) {
        auto& binsSyntax = syntax->as<BinsSelectionSyntax>();
        if (binsSyntax.iff) {
            iffExpr = &Expression::bind(*binsSyntax.iff->expr, context,
                                        ASTFlags::AllowCoverageSampleFormal);
            context.requireBooleanConvertible(*iffExpr);
        }

        selectExpr = &BinsSelectExpr::bind(*binsSyntax.expr, context);
        return;
    }

    auto& coverpoint = scope->asSymbol().as<CoverpointSymbol>();
    auto& type = coverpoint.getType();

    auto& binsSyntax = syntax->as<CoverageBinsSyntax>();
    if (binsSyntax.iff) {
        iffExpr = &Expression::bind(*binsSyntax.iff->expr, context,
                                    ASTFlags::AllowCoverageSampleFormal);
        context.requireBooleanConvertible(*iffExpr);
    }

    if (binsSyntax.size && binsSyntax.size->expr) {
        numberOfBinsExpr = &bindCovergroupExpr(*binsSyntax.size->expr, context);
        context.requireIntegral(*numberOfBinsExpr);
    }

    auto bindWithExpr = [&](const WithClauseSyntax& withSyntax) {
        // Create the iterator variable and set it up with an AST context so that it
        // can be found by the iteration expression.
        auto it = comp.emplace<IteratorSymbol>(*context.scope, "item"sv, coverpoint.location, type);

        ASTContext iterCtx = context;
        it->nextTemp = std::exchange(iterCtx.firstTempVar, it);

        withExpr = &bindCovergroupExpr(*withSyntax.expr, iterCtx);
        iterCtx.requireBooleanConvertible(*withExpr);
    };

    auto init = binsSyntax.initializer;
    switch (init->kind) {
        case SyntaxKind::RangeCoverageBinInitializer: {
            SmallVector<const Expression*> buffer;
            auto& rcbis = init->as<RangeCoverageBinInitializerSyntax>();
            for (auto elem : rcbis.ranges->valueRanges) {
                bitmask<ASTFlags> flags;
                if (elem->kind == SyntaxKind::OpenRangeExpression)
                    flags = ASTFlags::AllowUnboundedLiteral;

                auto& expr = bindCovergroupExpr(*elem, context, &type, flags);
                buffer.push_back(&expr);
            }
            values = buffer.copy(comp);

            if (rcbis.withClause)
                bindWithExpr(*rcbis.withClause);
            break;
        }
        case SyntaxKind::IdWithExprCoverageBinInitializer: {
            auto& iwecbi = init->as<IdWithExprCoverageBinInitializerSyntax>();
            bindWithExpr(*iwecbi.withClause);

            auto targetName = iwecbi.id.valueText();
            if (!targetName.empty() && targetName != coverpoint.name)
                context.addDiag(diag::CoverageBinTargetName, iwecbi.id.range()) << coverpoint.name;
            break;
        }
        case SyntaxKind::TransListCoverageBinInitializer: {
            SmallVector<TransSet, 4> listBuffer;
            for (auto setElem : init->as<TransListCoverageBinInitializerSyntax>().sets) {
                SmallVector<TransRangeList, 4> setBuffer;
                for (auto rangeElem : setElem->ranges)
                    setBuffer.emplace_back(*rangeElem, type, context);
                listBuffer.push_back(setBuffer.copy(comp));
            }
            transList = listBuffer.copy(comp);
            break;
        }
        case SyntaxKind::ExpressionCoverageBinInitializer:
            setCoverageExpr = &bindCovergroupExpr(
                *init->as<ExpressionCoverageBinInitializerSyntax>().expr, context);

            if (!setCoverageExpr->bad()) {
                auto& t = *setCoverageExpr->type;
                if (!t.isArray() || t.isAssociativeArray() ||
                    !type.isAssignmentCompatible(*t.getArrayElementType())) {

                    auto& diag = context.addDiag(diag::CoverageSetType,
                                                 setCoverageExpr->sourceRange);
                    diag << t << coverpoint.name << type;
                }
            }
            break;
        case SyntaxKind::DefaultCoverageBinInitializer:
            // Already handled at construction time.
            break;
        default:
            ASSUME_UNREACHABLE;
    }
}